

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O1

Intersectors * __thiscall
embree::BVH4Factory::BVH4Triangle4vIntersectors
          (Intersectors *__return_storage_ptr__,BVH4Factory *this,BVH4 *bvh,
          IntersectVariant ivariant)

{
  Intersector16 local_38;
  
  (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
  (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
  (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
  (__return_storage_ptr__->collider).name = (char *)0x0;
  __return_storage_ptr__->ptr = (AccelData *)0x0;
  __return_storage_ptr__->leafIntersector = (void *)0x0;
  memset(&(__return_storage_ptr__->intersector1).name,0,0xe0);
  __return_storage_ptr__->ptr = &bvh->super_AccelData;
  (*this->BVH4Triangle4vIntersector1Pluecker)(&__return_storage_ptr__->intersector1);
  (*this->BVH4Triangle4vIntersector4HybridPluecker)((Intersector4 *)&local_38);
  (__return_storage_ptr__->intersector4).name = local_38.name;
  *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_38.intersect._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
       local_38.intersect._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_38.occluded._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
       local_38.occluded._4_4_;
  (*this->BVH4Triangle4vIntersector8HybridPluecker)((Intersector8 *)&local_38);
  (__return_storage_ptr__->intersector8).name = local_38.name;
  *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_38.intersect._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
       local_38.intersect._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_38.occluded._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
       local_38.occluded._4_4_;
  (*this->BVH4Triangle4vIntersector16HybridPluecker)(&local_38);
  (__return_storage_ptr__->intersector16).name = local_38.name;
  (__return_storage_ptr__->intersector16).intersect =
       (IntersectFunc16)CONCAT44(local_38.intersect._4_4_,local_38.intersect._0_4_);
  (__return_storage_ptr__->intersector16).occluded =
       (OccludedFunc16)CONCAT44(local_38.occluded._4_4_,local_38.occluded._0_4_);
  return __return_storage_ptr__;
}

Assistant:

Accel::Intersectors BVH4Factory::BVH4Triangle4vIntersectors(BVH4* bvh, IntersectVariant ivariant)
  {
    assert(ivariant == IntersectVariant::ROBUST);
    Accel::Intersectors intersectors;
    intersectors.ptr = bvh;
    intersectors.intersector1  = BVH4Triangle4vIntersector1Pluecker();
#if defined (EMBREE_RAY_PACKETS)
    intersectors.intersector4  = BVH4Triangle4vIntersector4HybridPluecker();
    intersectors.intersector8  = BVH4Triangle4vIntersector8HybridPluecker();
    intersectors.intersector16 = BVH4Triangle4vIntersector16HybridPluecker();
#endif
    return intersectors;
  }